

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireSimulationDataGenerator.cpp
# Opt level: O2

U32 __thiscall
OneWireSimulationDataGenerator::GenerateSimulationData
          (OneWireSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  ulong uVar1;
  U32 delay;
  uint uVar2;
  unsigned_long_long local_60;
  SimulationChannelDescriptor **local_58;
  ulong local_50;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> device_ROMs;
  
  local_58 = simulation_channels;
  local_50 = AnalyzerHelpers::AdjustSimulationTargetSample
                       (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while (uVar1 = SimulationChannelDescriptor::GetCurrentSampleNumber(), uVar1 < local_50) {
    uVar2 = (uint)&this->mOneWireSimulationData;
    SimulationChannelDescriptor::Advance(uVar2);
    SimResetPacket(this);
    SimReadRom(this,0x8877665544332211);
    SimulationChannelDescriptor::Advance(uVar2);
    SimWriteByte(this,0x37);
    SimulationChannelDescriptor::Advance(uVar2);
    SimWriteByte(this,0xf0);
    device_ROMs.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    device_ROMs.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    device_ROMs.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60 = 0x8877665544332211;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
    emplace_back<unsigned_long_long>
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               &device_ROMs.
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>,
               &local_60);
    local_60 = 0x1122334455667788;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
    emplace_back<unsigned_long_long>
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               &device_ROMs.
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>,
               &local_60);
    SimResetPacket(this);
    SimSearchRom(this,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                      &device_ROMs.
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
    SimulationChannelDescriptor::Advance(uVar2);
    SimWriteByte(this,0xf);
    SimulationChannelDescriptor::Advance(uVar2);
    SimWriteByte(this,0xf0);
    SimulationChannelDescriptor::Advance(uVar2);
    SimWriteByte(this,0x55);
    SimulationChannelDescriptor::Advance(uVar2);
    SimWriteByte(this,0x18);
    SimResetPacket(this);
    SimMatchRom(this,0xf0e1d2c3b4a59687,false);
    SimulationChannelDescriptor::Advance(uVar2);
    SimWriteByte(this,0x55);
    SimulationChannelDescriptor::Advance(uVar2);
    SimWriteByte(this,0x18);
    SimResetPacket(this);
    SimulationChannelDescriptor::Advance(uVar2);
    SimWriteByte(this,0xec);
    if (this->mSimOverdrive == false) {
      SimResetPacket(this);
      SimOverdriveSkipRom(this);
    }
    std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
              (&device_ROMs.
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  }
  *local_58 = &this->mOneWireSimulationData;
  return 1;
}

Assistant:

U32 OneWireSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                            SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mOneWireSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        U32 delay;
        if( mSimOverdrive == true )
            delay = 30;
        else
            delay = 250;

        mOneWireSimulationData.Advance( U32( UsToSamples( delay * 3 ) ) );
        // mSimulationSampleIndex += UsToSamples(delay * 3, true);

        SimResetPacket();
        SimReadRom( 0x8877665544332211ull );

        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x37 );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0xF0 );

        std::vector<U64> device_ROMs;
        device_ROMs.push_back( 0x8877665544332211ull );
        device_ROMs.push_back( 0x1122334455667788ull );

        SimResetPacket();
        U64 found_device;
        found_device = SimSearchRom( device_ROMs );

        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x0F );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0xF0 );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x55 );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x18 );

        SimResetPacket();
        SimMatchRom( 0xF0E1D2C3B4A59687ull );


        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x55 );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x18 );


        SimResetPacket();
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0xEC );


        if( !mSimOverdrive )
        {
            SimResetPacket();
            SimOverdriveSkipRom();
        }
    }

    *simulation_channels = &mOneWireSimulationData;


    return 1; // we are retuning the size of the SimulationChannelDescriptor array.  In our case, the "array" is length 1.
}